

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
* __thiscall
CFG::filterAll0orAll1
          (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           *__return_storage_ptr__,CFG *this,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *vector)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference this_00;
  reference __x;
  reference rVar5;
  iterator iVar6;
  reference rVar7;
  undefined1 local_100 [8];
  reference el;
  undefined1 local_e0 [8];
  iterator __end2;
  undefined1 local_c0 [8];
  iterator __begin2;
  vector<bool,_std::allocator<bool>_> *__range2;
  undefined1 auStack_a0 [7];
  bool done;
  _Bit_type local_98;
  byte local_8d;
  bool symbol;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> permu;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *__range1;
  undefined1 local_38 [8];
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  filtered;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *vector_local;
  CFG *this_local;
  
  filtered.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vector;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)local_38);
  sVar4 = std::
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          ::size(vector);
  if (sVar4 != 0) {
    this_00 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[](vector,0);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(this_00);
    if (sVar4 != 0) {
      __end1 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::begin(vector);
      permu.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage =
           (_Bit_pointer)
           std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::end(vector);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                                    *)&permu.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_end_of_storage);
        if (!bVar1) break;
        __x = __gnu_cxx::
              __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
              ::operator*(&__end1);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_80,__x);
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_80,0);
        _auStack_a0 = rVar5;
        local_8d = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_a0);
        bVar1 = false;
        __begin2.super__Bit_iterator_base._8_8_ = local_80;
        iVar6 = std::vector<bool,_std::allocator<bool>_>::begin
                          ((vector<bool,_std::allocator<bool>_> *)
                           __begin2.super__Bit_iterator_base._8_8_);
        __end2.super__Bit_iterator_base._8_8_ = iVar6.super__Bit_iterator_base._M_p;
        __begin2.super__Bit_iterator_base._M_p._0_4_ = iVar6.super__Bit_iterator_base._M_offset;
        local_c0 = (undefined1  [8])__end2.super__Bit_iterator_base._8_8_;
        iVar6 = std::vector<bool,_std::allocator<bool>_>::end
                          ((vector<bool,_std::allocator<bool>_> *)
                           __begin2.super__Bit_iterator_base._8_8_);
        el._M_mask = (_Bit_type)iVar6.super__Bit_iterator_base._M_p;
        __end2.super__Bit_iterator_base._M_p._0_4_ = iVar6.super__Bit_iterator_base._M_offset;
        local_e0 = (undefined1  [8])el._M_mask;
        while( true ) {
          bVar2 = std::operator!=((_Bit_iterator_base *)local_c0,(_Bit_iterator_base *)local_e0);
          if (!bVar2) break;
          rVar7 = std::_Bit_iterator::operator*((_Bit_iterator *)local_c0);
          el._M_p = (_Bit_type *)rVar7._M_mask;
          local_100 = (undefined1  [8])rVar7._M_p;
          if (!bVar1) {
            bVar2 = (bool)(local_8d & 1);
            bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)local_100);
            rVar7._M_mask = (_Bit_type)el._M_p;
            rVar7._M_p = (_Bit_type *)local_100;
            if (bVar2 != bVar3) {
              std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::push_back((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           *)local_38,(value_type *)local_80);
              rVar7._M_mask = (_Bit_type)el._M_p;
              rVar7._M_p = (_Bit_type *)local_100;
              bVar1 = true;
            }
          }
          el._M_p = (_Bit_type *)rVar7._M_mask;
          local_100 = (undefined1  [8])rVar7._M_p;
          std::_Bit_iterator::operator++((_Bit_iterator *)local_c0);
        }
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_80);
        __gnu_cxx::
        __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
        ::operator++(&__end1);
      }
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::vector(__return_storage_ptr__,
               (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *)local_38);
      goto LAB_001362bc;
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(__return_storage_ptr__,vector);
LAB_001362bc:
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<bool>> CFG::filterAll0orAll1(std::vector<std::vector<bool>> vector) {
    std::vector<std::vector<bool>> filtered;

    if (vector.size() == 0 or vector[0].size() == 0) return vector;

    for (auto permu: vector) {
        bool symbol = permu[0];
        bool done = false;
        for (auto el: permu) {
            if (!done and symbol != el) {
                filtered.push_back(permu);
                done = true;
            }
        }
    }
    return filtered;
}